

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

ecs_entity_t
ecs_new_trigger(ecs_world_t *world,ecs_entity_t e,char *name,ecs_entity_t kind,char *component_name,
               ecs_iter_action_t action)

{
  ecs_entity_t eVar1;
  ecs_entity_t entity;
  ecs_entity_t *peVar2;
  int32_t line;
  _Bool added;
  _Bool local_39;
  ecs_entity_t local_38;
  
  local_38 = kind;
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == ECS_WORLD_MAGIC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x364,
                  "ecs_entity_t ecs_new_trigger(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  eVar1 = ecs_lookup_path_w_sep(world,0,component_name,".",(char *)0x0);
  _ecs_assert(eVar1 != 0,3,component_name,"component != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x367);
  if (eVar1 == 0) {
    __assert_fail("component != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x367,
                  "ecs_entity_t ecs_new_trigger(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  entity = ecs_lookup_w_id(world,e,name);
  if (entity == 0) {
    entity = ecs_new_entity(world,0,name,(char *)0x0);
  }
  local_39 = false;
  peVar2 = (ecs_entity_t *)ecs_get_mut_w_entity(world,entity,4,&local_39);
  if (local_39 == true) {
    *peVar2 = local_38;
    peVar2[1] = (ecs_entity_t)action;
    peVar2[2] = eVar1;
    peVar2[4] = 0;
LAB_0013039b:
    ecs_modified_w_entity(world,entity,4);
    return entity;
  }
  if (*peVar2 == local_38) {
    if (peVar2[2] == eVar1) {
      if ((ecs_iter_action_t)peVar2[1] != action) {
        peVar2[1] = (ecs_entity_t)action;
      }
      goto LAB_0013039b;
    }
    line = 0x37b;
  }
  else {
    line = 0x377;
  }
  _ecs_abort(0xe,name,
             "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
             ,line);
  abort();
}

Assistant:

ecs_entity_t ecs_new_trigger(
    ecs_world_t *world,
    ecs_entity_t e,
    const char *name,
    ecs_entity_t kind,
    const char *component_name,
    ecs_iter_action_t action)
{
    assert(world->magic == ECS_WORLD_MAGIC);

    ecs_entity_t component = ecs_lookup_fullpath(world, component_name);
    ecs_assert(component != 0, ECS_INVALID_COMPONENT_ID, component_name);

    ecs_entity_t result = ecs_lookup_w_id(world, e, name);
    if (!result) {
        result = ecs_new_entity(world, 0, name, NULL);
    }

    bool added = false;
    EcsTrigger *trigger = ecs_get_mut(world, result, EcsTrigger, &added);
    if (added) {
        trigger->kind = kind;
        trigger->action = action;
        trigger->component = component;
        trigger->ctx = NULL;
    } else {
        if (trigger->kind != kind) {
            ecs_abort(ECS_ALREADY_DEFINED, name);
        }

        if (trigger->component != component) {
            ecs_abort(ECS_ALREADY_DEFINED, name);
        }

        if (trigger->action != action) {
            trigger->action = action;
        }
    }
    
    ecs_modified(world, result, EcsTrigger);

    return result;
}